

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetJavaClassFullName
          (string *__return_storage_ptr__,ClassNameResolver *this,string *name_without_package,
          FileDescriptor *file,bool immutable)

{
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(char *)(*(long *)(file + 0xa0) + 0xa0) == '\x01') {
    FileJavaPackage_abi_cxx11_
              (&local_78,(java *)file,(FileDescriptor *)(ulong)immutable,SUB81(file,0));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    GetClassName_abi_cxx11_(&local_78,this,file,immutable);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::string((string *)&local_38,".",&local_79);
  std::__cxx11::string::string((string *)&local_58,"$",&local_7a);
  StringReplace(&local_78,name_without_package,&local_38,&local_58,true);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string ClassNameResolver::GetJavaClassFullName(
    const string& name_without_package,
    const FileDescriptor* file,
    bool immutable) {
  string result;
  if (MultipleJavaFiles(file, immutable)) {
    result = FileJavaPackage(file, immutable);
    if (!result.empty()) result += '.';
  } else {
    result = GetClassName(file, immutable);
    if (!result.empty()) result += '$';
  }
  result += StringReplace(name_without_package, ".", "$", true);
  return result;
}